

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O3

void PrintGraph(ExpressionGraphContext *ctx,ScopeData *scope,bool printImported)

{
  undefined8 uVar1;
  FunctionData *pFVar2;
  char *pcVar3;
  NamespaceData *pNVar4;
  TypeBase *pTVar5;
  ModuleData *pMVar6;
  VariableData *pVVar7;
  AliasData *pAVar8;
  ScopeData *scope_00;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  uint i;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  bool bVar17;
  
  PrintIndent(ctx);
  if ((ulong)scope->type < 6) {
    uVar1 = *(undefined8 *)(&DAT_002236f8 + (ulong)scope->type * 8);
    pFVar2 = scope->ownerFunction;
    if (pFVar2 == (FunctionData *)0x0) {
      pTVar5 = scope->ownerType;
      if (pTVar5 == (TypeBase *)0x0) {
        pNVar4 = scope->ownerNamespace;
        if (pNVar4 == (NamespaceData *)0x0) {
          Print(ctx,"ScopeData(%s, {}: s%04x) @ 0x%x-0x%x {\n",uVar1,(ulong)scope->uniqueId,
                (ulong)(uint)scope->startOffset,(ulong)(uint)scope->dataSize);
        }
        else {
          pcVar3 = (pNVar4->name).name.begin;
          Print(ctx,"ScopeData(%s, {%.*s: n%04x}: s%04x){\n",uVar1,
                (ulong)(uint)(*(int *)&(pNVar4->name).name.end - (int)pcVar3),pcVar3,
                (ulong)pNVar4->uniqueId,(ulong)scope->uniqueId);
        }
      }
      else {
        pcVar3 = (pTVar5->name).begin;
        Print(ctx,"ScopeData(%s, {%.*s}: s%04x){\n",uVar1,
              (ulong)(uint)(*(int *)&(pTVar5->name).end - (int)pcVar3),pcVar3,(ulong)scope->uniqueId
             );
      }
    }
    else {
      pcVar3 = (pFVar2->name->name).begin;
      Print(ctx,"ScopeData(%s, {%.*s: f%04x}: s%04x) @ 0x%x-0x%x {\n",uVar1,
            (ulong)(uint)(*(int *)&(pFVar2->name->name).end - (int)pcVar3),pcVar3,
            (ulong)pFVar2->uniqueId,(ulong)scope->uniqueId,(ulong)(uint)scope->startOffset,
            (ulong)(uint)scope->dataSize);
    }
    ctx->depth = ctx->depth + 1;
    if ((scope->types).count != 0) {
      PrintEnterBlock(ctx,"types");
      if ((scope->types).count != 0) {
        uVar13 = 0;
        do {
          pTVar5 = (scope->types).data[uVar13];
          bVar17 = false;
          if ((pTVar5 != (TypeBase *)0x0) && (pTVar5->typeID == 0x18)) {
            bVar17 = pTVar5->importModule != (ModuleData *)0x0;
          }
          if (bVar17 == printImported) {
            PrintIndent(ctx);
            pMVar6 = pTVar5->importModule;
            pcVar3 = (pTVar5->name).begin;
            uVar10 = (ulong)(uint)(*(int *)&(pTVar5->name).end - (int)pcVar3);
            if (pTVar5->isGeneric == true) {
              if (pMVar6 == (ModuleData *)0x0) {
                Print(ctx,"%.*s: generic\n",uVar10);
              }
              else {
                Print(ctx,"%.*s: generic from %.*s\n",uVar10,pcVar3,
                      (ulong)(uint)(*(int *)&(pMVar6->name).end - (int)(pMVar6->name).begin));
              }
            }
            else {
              pcVar12 = "";
              if (pTVar5->hasPointers != false) {
                pcVar12 = " gc_check";
              }
              uVar11 = (ulong)(uint)pTVar5->size;
              if (pMVar6 == (ModuleData *)0x0) {
                Print(ctx,"%.*s: size(%d) align(%d) padding(%d)%s\n",uVar10,pcVar3,uVar11,
                      (ulong)pTVar5->alignment,(ulong)pTVar5->padding,pcVar12);
              }
              else {
                pcVar16 = (pMVar6->name).begin;
                Print(ctx,"%.*s: size(%d) align(%d) padding(%d)%s from %.*s\n",uVar10,pcVar3,uVar11,
                      (ulong)pTVar5->alignment,(ulong)pTVar5->padding,pcVar12,
                      (ulong)(uint)(*(int *)&(pMVar6->name).end - (int)pcVar16),pcVar16);
              }
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (scope->types).count);
      }
      ctx->depth = ctx->depth - 1;
      PrintIndent(ctx);
      OutputContext::Print(ctx->output,"}\n",2);
    }
    if ((scope->functions).count != 0) {
      PrintEnterBlock(ctx,"functions");
      uVar9 = (scope->functions).count;
      if (uVar9 != 0) {
        uVar13 = 0;
        do {
          pFVar2 = (scope->functions).data[uVar13];
          if ((pFVar2->importModule == (ModuleData *)0x0) != printImported) {
            pcVar3 = (pFVar2->name->name).begin;
            PrintIndented(ctx,pFVar2->type,(TypeBase *)"%.*s: f%04x",(char *)0x0,0,
                          (ulong)(uint)(*(int *)&(pFVar2->name->name).end - (int)pcVar3),pcVar3,
                          (ulong)pFVar2->uniqueId);
            uVar9 = (scope->functions).count;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar9);
      }
      ctx->depth = ctx->depth - 1;
      PrintIndent(ctx);
      OutputContext::Print(ctx->output,"}\n",2);
    }
    if ((scope->variables).count != 0) {
      PrintEnterBlock(ctx,"variables");
      uVar9 = (scope->variables).count;
      if (uVar9 != 0) {
        uVar13 = 0;
        do {
          pVVar7 = (scope->variables).data[uVar13];
          if ((pVVar7->importModule == (ModuleData *)0x0) != printImported) {
            pcVar3 = (pVVar7->name->name).begin;
            pcVar12 = "";
            if (pVVar7->isReadonly != false) {
              pcVar12 = " readonly";
            }
            pcVar16 = "";
            if (pVVar7->isReference != false) {
              pcVar16 = " reference";
            }
            pcVar14 = "";
            if (pVVar7->usedAsExternal != false) {
              pcVar14 = " captured";
            }
            pcVar15 = "";
            if (pVVar7->type->hasPointers != false) {
              pcVar15 = " gc_check";
            }
            PrintIndented(ctx,pVVar7->type,(TypeBase *)"%.*s: v%04x @ 0x%x%s%s%s%s",(char *)0x0,0,
                          (ulong)(uint)(*(int *)&(pVVar7->name->name).end - (int)pcVar3),pcVar3,
                          (ulong)pVVar7->uniqueId,(ulong)pVVar7->offset,pcVar12,pcVar16,pcVar14,
                          pcVar15);
            uVar9 = (scope->variables).count;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar9);
      }
      ctx->depth = ctx->depth - 1;
      PrintIndent(ctx);
      OutputContext::Print(ctx->output,"}\n",2);
    }
    if ((scope->aliases).count != 0) {
      PrintEnterBlock(ctx,"aliases");
      uVar9 = (scope->aliases).count;
      if (uVar9 != 0) {
        uVar13 = 0;
        do {
          pAVar8 = (scope->aliases).data[uVar13];
          if ((pAVar8->importModule == (ModuleData *)0x0) != printImported) {
            pcVar3 = (pAVar8->name->name).begin;
            PrintIndented(ctx,pAVar8->type,(TypeBase *)"%.*s: a%04x","typedef","",
                          (ulong)(uint)(*(int *)&(pAVar8->name->name).end - (int)pcVar3),pcVar3,
                          (ulong)pAVar8->uniqueId);
            uVar9 = (scope->aliases).count;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar9);
      }
      ctx->depth = ctx->depth - 1;
      PrintIndent(ctx);
      OutputContext::Print(ctx->output,"}\n",2);
    }
    uVar9 = (scope->scopes).count;
    if (uVar9 != 0) {
      uVar13 = 0;
      do {
        scope_00 = (scope->scopes).data[uVar13];
        if ((scope_00->ownerFunction == (FunctionData *)0x0) ||
           (scope_00->ownerFunction->importModule == (ModuleData *)0x0)) {
          bVar17 = ContainsData(scope_00,printImported);
          if (bVar17) {
            PrintGraph(ctx,scope_00,printImported);
            uVar9 = (scope->scopes).count;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar9);
    }
    ctx->depth = ctx->depth - 1;
    PrintIndent(ctx);
    Print(ctx,"}\n");
    return;
  }
  __assert_fail("!\"unknown type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionGraph.cpp"
                ,0xf2,"void PrintGraph(ExpressionGraphContext &, ScopeData *, bool)");
}

Assistant:

void PrintGraph(ExpressionGraphContext &ctx, ScopeData *scope, bool printImported)
{
	PrintIndent(ctx);

	const char *type = "";

	switch(scope->type)
	{
	case SCOPE_EXPLICIT:
		type = "SCOPE_EXPLICIT";
		break;
	case SCOPE_NAMESPACE:
		type = "SCOPE_NAMESPACE";
		break;
	case SCOPE_FUNCTION:
		type = "SCOPE_FUNCTION";
		break;
	case SCOPE_TYPE:
		type = "SCOPE_TYPE";
		break;
	case SCOPE_LOOP:
		type = "SCOPE_LOOP";
		break;
	case SCOPE_TEMPORARY:
		type = "SCOPE_TEMPORARY";
		break;
	default:
		assert(!"unknown type");
	}

	if(FunctionData *owner = scope->ownerFunction)
		Print(ctx, "ScopeData(%s, {%.*s: f%04x}: s%04x) @ 0x%x-0x%x {\n", type, FMT_ISTR(owner->name->name), owner->uniqueId, scope->uniqueId, unsigned(scope->startOffset), unsigned(scope->dataSize));
	else if(TypeBase *owner = scope->ownerType)
		Print(ctx, "ScopeData(%s, {%.*s}: s%04x){\n", type, FMT_ISTR(owner->name), scope->uniqueId);
	else if(NamespaceData *owner = scope->ownerNamespace)
		Print(ctx, "ScopeData(%s, {%.*s: n%04x}: s%04x){\n", type, FMT_ISTR(owner->name.name), owner->uniqueId, scope->uniqueId);
	else
		Print(ctx, "ScopeData(%s, {}: s%04x) @ 0x%x-0x%x {\n", type, scope->uniqueId, unsigned(scope->startOffset), unsigned(scope->dataSize));

	ctx.depth++;

	if(!scope->types.empty())
	{
		PrintEnterBlock(ctx, "types");

		for(unsigned i = 0; i < scope->types.size(); i++)
		{
			TypeBase *data = scope->types[i];

			bool imported = getType<TypeClass>(data) && getType<TypeClass>(data)->importModule != NULL;

			if(printImported != imported)
				continue;

			PrintIndent(ctx);

			if(data->isGeneric)
			{
				if(data->importModule)
					Print(ctx, "%.*s: generic from %.*s\n", FMT_ISTR(data->name), FMT_ISTR(data->importModule->name));
				else
					Print(ctx, "%.*s: generic\n", FMT_ISTR(data->name));
			}
			else
			{
				if(data->importModule)
					Print(ctx, "%.*s: size(%d) align(%d) padding(%d)%s from %.*s\n", FMT_ISTR(data->name), unsigned(data->size), data->alignment, data->padding, data->hasPointers ? " gc_check" : "", FMT_ISTR(data->importModule->name));
				else
					Print(ctx, "%.*s: size(%d) align(%d) padding(%d)%s\n", FMT_ISTR(data->name), unsigned(data->size), data->alignment, data->padding, data->hasPointers ? " gc_check" : "");
			}
		}

		PrintLeaveBlock(ctx);
	}

	if(!scope->functions.empty())
	{
		PrintEnterBlock(ctx, "functions");

		for(unsigned i = 0; i < scope->functions.size(); i++)
		{
			FunctionData *data = scope->functions[i];

			bool imported = data->importModule != NULL;

			if(printImported != imported)
				continue;

			PrintIndented(ctx, InplaceStr(), data->type, "%.*s: f%04x", FMT_ISTR(data->name->name), data->uniqueId);
		}

		PrintLeaveBlock(ctx);
	}

	if(!scope->variables.empty())
	{
		PrintEnterBlock(ctx, "variables");

		for(unsigned i = 0; i < scope->variables.size(); i++)
		{
			VariableData *data = scope->variables[i];

			bool imported = data->importModule != NULL;

			if(printImported != imported)
				continue;

			PrintIndented(ctx, InplaceStr(), data->type, "%.*s: v%04x @ 0x%x%s%s%s%s", FMT_ISTR(data->name->name), data->uniqueId, data->offset, data->isReadonly ? " readonly" : "", data->isReference ? " reference" : "", data->usedAsExternal ? " captured" : "", data->type->hasPointers ? " gc_check" : "");
		}

		PrintLeaveBlock(ctx);
	}

	if(!scope->aliases.empty())
	{
		PrintEnterBlock(ctx, "aliases");

		for(unsigned i = 0; i < scope->aliases.size(); i++)
		{
			AliasData *data = scope->aliases[i];

			bool imported = data->importModule != NULL;

			if(printImported != imported)
				continue;

			PrintIndented(ctx, InplaceStr("typedef"), data->type, "%.*s: a%04x", FMT_ISTR(data->name->name), data->uniqueId);
		}

		PrintLeaveBlock(ctx);
	}

	if(!scope->scopes.empty())
	{
		for(unsigned i = 0; i < scope->scopes.size(); i++)
		{
			ScopeData *data = scope->scopes[i];

			if(data->ownerFunction && data->ownerFunction->importModule != NULL)
				continue;

			if(ContainsData(data, printImported))
				PrintGraph(ctx, data, printImported);
		}
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, "}\n");
}